

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_test.cpp
# Opt level: O3

void __thiscall Sinc_ZeroHandling_Test::TestBody(Sinc_ZeroHandling_Test *this)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  char *pcVar6;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Float cur;
  Float prev;
  AssertionResult gtest_ar;
  float local_78;
  float local_74;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  float local_64;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar7 = 10000;
  fVar8 = 0.0;
  local_74 = 1.0;
  do {
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    fVar1 = fVar8 * 3.1415927;
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),
                             SUB6416(ZEXT464(0x3f800000),0));
    local_48 = fVar8;
    if ((auVar3._0_4_ != 1.0) || (fVar8 = 1.0, NAN(auVar3._0_4_))) {
      local_64 = fVar1;
      fVar8 = sinf(fVar1);
      fVar8 = fVar8 / local_64;
    }
    local_78 = fVar8;
    testing::internal::CmpHelperLE<float,float>(local_60,"cur","prev",&local_78,&local_74);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      pcVar6 = "";
      if (local_58.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar6 = ((local_58.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/filters_test.cpp"
                 ,0x16,pcVar6);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_70.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    fVar8 = INFINITY;
    auVar3._4_4_ = uStack_44;
    auVar3._0_4_ = local_48;
    auVar3._8_4_ = uStack_40;
    auVar3._12_4_ = uStack_3c;
    if (local_48 < INFINITY) {
      auVar9._0_12_ = ZEXT812(0);
      auVar9._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar3,auVar9,0);
      local_48 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)local_48);
      fVar8 = (float)((-(uint)(local_48 < 0.0) | 1) + (int)local_48);
    }
    local_74 = local_78;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  iVar7 = 10000;
  fVar8 = 0.0;
  local_74 = 1.0;
  do {
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    fVar1 = fVar8 * 3.1415927;
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),
                             SUB6416(ZEXT464(0x3f800000),0));
    local_48 = fVar8;
    if ((auVar3._0_4_ != 1.0) || (fVar8 = 1.0, NAN(auVar3._0_4_))) {
      local_64 = fVar1;
      fVar8 = sinf(fVar1);
      fVar8 = fVar8 / local_64;
    }
    local_78 = fVar8;
    testing::internal::CmpHelperLE<float,float>(local_60,"cur","prev",&local_78,&local_74);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      pcVar6 = "";
      if (local_58.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar6 = ((local_58.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/filters_test.cpp"
                 ,0x1f,pcVar6);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_70.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    fVar8 = -INFINITY;
    auVar4._4_4_ = uStack_44;
    auVar4._0_4_ = local_48;
    auVar4._8_4_ = uStack_40;
    auVar4._12_4_ = uStack_3c;
    if (-INFINITY < local_48) {
      auVar10._0_12_ = ZEXT812(0);
      auVar10._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar4,auVar10,0);
      bVar5 = (bool)((byte)uVar2 & 1);
      fVar8 = (float)((uint)bVar5 * -0x80000000 + (uint)!bVar5 * (int)local_48);
      fVar8 = (float)((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
    }
    local_74 = local_78;
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  return;
}

Assistant:

TEST(Sinc, ZeroHandling) {
    Float x = 0;
    Float prev = 1;
    for (int i = 0; i < 10000; ++i) {
        Float cur = Sinc(x);
        EXPECT_LE(cur, prev);
        x = NextFloatUp(x);
        prev = cur;
    }

    x = -0;
    prev = 1;
    for (int i = 0; i < 10000; ++i) {
        Float cur = Sinc(x);
        EXPECT_LE(cur, prev);
        x = NextFloatDown(x);
        prev = cur;
    }
}